

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<long,_27>::Resize(TPZManVector<long,_27> *this,int64_t newsize,long *object)

{
  long *plVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  int64_t i;
  long lVar6;
  double dVar7;
  
  if (-1 < newsize) {
    lVar6 = (this->super_TPZVec<long>).fNElements;
    if (lVar6 != newsize) {
      lVar2 = (this->super_TPZVec<long>).fNAlloc;
      if (lVar2 < newsize) {
        if ((ulong)newsize < 0x1c) {
          plVar4 = (this->super_TPZVec<long>).fStore;
          plVar1 = this->fExtAlloc;
          lVar2 = 0;
          if (lVar6 < 1) {
            lVar6 = lVar2;
          }
          for (; lVar6 != lVar2; lVar2 = lVar2 + 1) {
            plVar1[lVar2] = plVar4[lVar2];
          }
          for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
            plVar1[lVar6] = *object;
          }
          if (plVar4 != (long *)0x0 && plVar4 != plVar1) {
            operator_delete__(plVar4);
          }
          (this->super_TPZVec<long>).fStore = plVar1;
          (this->super_TPZVec<long>).fNElements = newsize;
          (this->super_TPZVec<long>).fNAlloc = 0x1b;
        }
        else {
          dVar7 = (double)lVar2 * 1.2;
          uVar5 = (long)dVar7;
          if (dVar7 < (double)newsize) {
            uVar5 = newsize;
          }
          lVar2 = 0;
          plVar4 = (long *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
          plVar1 = (this->super_TPZVec<long>).fStore;
          if (lVar6 < 1) {
            lVar6 = lVar2;
          }
          for (; lVar6 != lVar2; lVar2 = lVar2 + 1) {
            plVar4[lVar2] = plVar1[lVar2];
          }
          lVar2 = *object;
          for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
            plVar4[lVar6] = lVar2;
          }
          if (plVar1 != (long *)0x0 && plVar1 != this->fExtAlloc) {
            operator_delete__(plVar1);
          }
          (this->super_TPZVec<long>).fStore = plVar4;
          (this->super_TPZVec<long>).fNElements = newsize;
          (this->super_TPZVec<long>).fNAlloc = uVar5;
        }
      }
      else {
        plVar1 = (this->super_TPZVec<long>).fStore;
        for (; lVar6 < newsize; lVar6 = lVar6 + 1) {
          plVar1[lVar6] = *object;
        }
        (this->super_TPZVec<long>).fNElements = newsize;
      }
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}